

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O0

void map_fun(void *args,size_t size)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  size_t temp_size;
  void *temp_res;
  data_t *my_data;
  size_t size_local;
  void *args_local;
  
  pvVar2 = await(*(future_t **)((long)args + 8));
  uVar3 = (**(code **)((long)args + 0x10))
                    (pvVar2,*(undefined8 *)(*(long *)((long)args + 8) + 0x10),
                     *(long *)((long)args + 8) + 0x10);
  *(undefined8 *)(*args + 8) = uVar3;
  *(undefined1 *)(*args + 0x18) = 0;
  iVar1 = sem_post((sem_t *)(*args + 0x20));
  if (iVar1 != 0) {
    exit(-4);
  }
  free(args);
  return;
}

Assistant:

void map_fun(void *args, size_t size __attribute__((unused))) {
    data_t *my_data = args;

    void *temp_res = await(my_data->from);
    size_t temp_size = my_data->from->result_size;

    my_data->to->result = (my_data->function)(temp_res, temp_size, &(my_data->from->result_size));
    my_data->to->status = ready;

    if (sem_post(&(my_data->to->mutex))) {
        exit(semaphore_error);
    }
    free(my_data);
}